

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O2

void flatbuffers::tests::Offset64SizePrefix(void)

{
  bool expval;
  Offset<flatbuffers::String> near_string;
  Offset<RootTable> root;
  unsigned_long *puVar1;
  uint8_t *puVar2;
  String *pSVar3;
  Options local_f0;
  FlatBufferBuilder64 builder;
  Verifier verifier;
  
  builder.buf_.allocator_ = (Allocator *)0x0;
  builder.buf_.own_allocator_ = false;
  builder.buf_.initial_size_ = 0x400;
  builder.buf_.max_size_ = 0x7fffffffffffffff;
  builder.buf_.buffer_minalign_ = 8;
  builder.length_of_64_bit_region_ = 0;
  builder.nested = false;
  builder.finished = false;
  builder.buf_.reserved_ = 0;
  builder.buf_.size_ = 0;
  builder.buf_.buf_ = (uint8_t *)0x0;
  builder.buf_.cur_._0_6_ = 0;
  builder.buf_.cur_._6_2_ = 0;
  builder.buf_.scratch_._0_6_ = 0;
  builder._78_8_ = 0;
  builder.minalign_ = 1;
  builder.force_defaults_ = false;
  builder.dedup_vtables_ = true;
  builder.string_pool = (StringOffsetMap *)0x0;
  near_string = FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset>
                          (&builder,"some near string");
  root = CreateRootTable(&builder,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0,0
                         ,(Offset64<flatbuffers::String>)0x0,
                         (Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0,
                         near_string,
                         (Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0,
                         (Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>)0x0,
                         (Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>)0x0,
                         (Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>
                          )0x0,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FinishSizePrefixedRootTableBuffer(&builder,root);
  puVar1 = (unsigned_long *)FlatBufferBuilderImpl<true>::GetBufferPointer(&builder);
  TestEq<unsigned_long,unsigned_long>
            (*puVar1,builder.buf_.size_ - 8,
             "\'GetPrefixedSize<uoffset64_t>(builder.GetBufferPointer())\' != \'builder.GetSize() - sizeof(uoffset64_t)\'"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x163,"");
  local_f0.max_depth = 0x40;
  local_f0.max_tables = 1000000;
  local_f0.check_alignment = true;
  local_f0.check_nested_flatbuffers = true;
  local_f0.max_size = 0x7fffffffffffffff;
  local_f0.assert = true;
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer(&builder);
  VerifierTemplate<false>::VerifierTemplate(&verifier,puVar2,builder.buf_.size_,&local_f0);
  expval = VerifySizePrefixedRootTableBuffer(&verifier);
  TestEq<bool,bool>(expval,true,"\'VerifySizePrefixedRootTableBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x16c,"");
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer(&builder);
  pSVar3 = RootTable::near_string((RootTable *)(puVar2 + (ulong)*(uint *)(puVar2 + 8) + 8));
  TestEqStr((char *)(pSVar3 + 1),"some near string",
            "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0x172,"");
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&builder);
  return;
}

Assistant:

void Offset64SizePrefix() {
  FlatBufferBuilder64 builder;

  // First serialize a nested buffer.
  const Offset<String> near_string_offset =
      builder.CreateString("some near string");

  // Finish by building the root table by passing in all the offsets.
  const Offset<RootTable> root_table_offset =
      CreateRootTable(builder, 0, 0, 0, 0, near_string_offset, 0);

  // Finish the buffer.
  FinishSizePrefixedRootTableBuffer(builder, root_table_offset);

  TEST_EQ(GetPrefixedSize<uoffset64_t>(builder.GetBufferPointer()),
          builder.GetSize() - sizeof(uoffset64_t));

  Verifier::Options options;
  // Allow the verifier to verify 64-bit buffers.
  options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
  options.assert = true;

  Verifier verifier(builder.GetBufferPointer(), builder.GetSize(), options);

  TEST_EQ(VerifySizePrefixedRootTableBuffer(verifier), true);

  const RootTable *root_table =
      GetSizePrefixedRootTable(builder.GetBufferPointer());

  // Verify the fields.
  TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");
}